

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cpu.cpp
# Opt level: O0

Value xmrig::Cpu::toJSON(Document *doc)

{
  Id id;
  int iVar1;
  undefined4 extraout_var;
  undefined8 extraout_RDX;
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  *in_RSI;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *in_RDI;
  Value VVar2;
  Assembly assembly;
  ICpuInfo *i;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator;
  Value *cpu;
  char *in_stack_fffffffffffffe68;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *in_stack_fffffffffffffe70;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator_01;
  undefined4 in_stack_fffffffffffffed0;
  StringRefType *in_stack_fffffffffffffed8;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *in_stack_fffffffffffffee0;
  GenericStringRef<char> local_118 [2];
  GenericStringRef<char> local_f8;
  GenericStringRef<char> local_e8;
  GenericStringRef<char> local_d8;
  GenericStringRef<char> local_c8;
  GenericStringRef<char> local_b8;
  GenericStringRef<char> local_a8;
  GenericStringRef<char> local_98;
  GenericStringRef<char> local_88;
  GenericStringRef<char> local_78;
  GenericStringRef<char> local_68 [2];
  GenericStringRef<char> local_48 [2];
  Assembly local_28;
  undefined1 local_21;
  ICpuInfo *local_20;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *local_18;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator_00;
  
  allocator_01 = in_RDI;
  local_18 = rapidjson::
             GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
             ::GetAllocator(in_RSI);
  local_20 = info();
  local_21 = 0;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  GenericValue(in_stack_fffffffffffffe70,(Type)((ulong)in_stack_fffffffffffffe68 >> 0x20));
  id = (*local_20->_vptr_ICpuInfo[2])();
  Assembly::Assembly(&local_28,id);
  rapidjson::GenericStringRef<char>::GenericStringRef<6u>(local_48,(char (*) [6])"brand");
  iVar1 = (*local_20->_vptr_ICpuInfo[6])();
  allocator_00 = (MemoryPoolAllocator<rapidjson::CrtAllocator> *)CONCAT44(extraout_var,iVar1);
  rapidjson::StringRef<char>(in_stack_fffffffffffffe68);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
            (StringRefType *)CONCAT44(id,in_stack_fffffffffffffed0),allocator_01);
  rapidjson::GenericStringRef<char>::GenericStringRef<4u>(local_68,(char (*) [4])0x27cec6);
  (*local_20->_vptr_ICpuInfo[3])();
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<bool>((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)CONCAT44(id,in_stack_fffffffffffffed0),(StringRefType *)allocator_01,
                  SUB81((ulong)in_RDI >> 0x38,0),allocator_00);
  rapidjson::GenericStringRef<char>::GenericStringRef<5u>(&local_78,(char (*) [5])"avx2");
  (*local_20->_vptr_ICpuInfo[4])();
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<bool>((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)CONCAT44(id,in_stack_fffffffffffffed0),(StringRefType *)allocator_01,
                  SUB81((ulong)in_RDI >> 0x38,0),allocator_00);
  rapidjson::GenericStringRef<char>::GenericStringRef<4u>(&local_88,(char (*) [4])"x64");
  ICpuInfo::isX64();
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<bool>((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)CONCAT44(id,in_stack_fffffffffffffed0),(StringRefType *)allocator_01,
                  SUB81((ulong)in_RDI >> 0x38,0),allocator_00);
  rapidjson::GenericStringRef<char>::GenericStringRef<3u>(&local_98,(char (*) [3])"l2");
  (*local_20->_vptr_ICpuInfo[9])();
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<unsigned_long>
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)CONCAT44(id,in_stack_fffffffffffffed0),(StringRefType *)allocator_01,
             (unsigned_long)in_RDI,allocator_00);
  rapidjson::GenericStringRef<char>::GenericStringRef<3u>(&local_a8,(char (*) [3])"l3");
  (*local_20->_vptr_ICpuInfo[10])();
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<unsigned_long>
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)CONCAT44(id,in_stack_fffffffffffffed0),(StringRefType *)allocator_01,
             (unsigned_long)in_RDI,allocator_00);
  rapidjson::GenericStringRef<char>::GenericStringRef<6u>(&local_b8,(char (*) [6])"cores");
  (*local_20->_vptr_ICpuInfo[8])();
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<unsigned_long>
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)CONCAT44(id,in_stack_fffffffffffffed0),(StringRefType *)allocator_01,
             (unsigned_long)in_RDI,allocator_00);
  rapidjson::GenericStringRef<char>::GenericStringRef<8u>(&local_c8,(char (*) [8])"threads");
  (*local_20->_vptr_ICpuInfo[0xd])();
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<unsigned_long>
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)CONCAT44(id,in_stack_fffffffffffffed0),(StringRefType *)allocator_01,
             (unsigned_long)in_RDI,allocator_00);
  rapidjson::GenericStringRef<char>::GenericStringRef<9u>(&local_d8,(char (*) [9])"packages");
  (*local_20->_vptr_ICpuInfo[0xc])();
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<unsigned_long>
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)CONCAT44(id,in_stack_fffffffffffffed0),(StringRefType *)allocator_01,
             (unsigned_long)in_RDI,allocator_00);
  rapidjson::GenericStringRef<char>::GenericStringRef<6u>(&local_e8,(char (*) [6])"nodes");
  (*local_20->_vptr_ICpuInfo[0xb])();
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<unsigned_long>
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)CONCAT44(id,in_stack_fffffffffffffed0),(StringRefType *)allocator_01,
             (unsigned_long)in_RDI,allocator_00);
  rapidjson::GenericStringRef<char>::GenericStringRef<8u>(&local_f8,(char (*) [8])"backend");
  (*local_20->_vptr_ICpuInfo[5])();
  rapidjson::StringRef<char>(in_stack_fffffffffffffe68);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
            (StringRefType *)CONCAT44(id,in_stack_fffffffffffffed0),allocator_01);
  rapidjson::GenericStringRef<char>::GenericStringRef<9u>(local_118,(char (*) [9])"assembly");
  rapidjson::GenericStringRef<char>::GenericStringRef<5u>
            ((GenericStringRef<char> *)&stack0xfffffffffffffed8,(char (*) [5])"none");
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
            (StringRefType *)CONCAT44(id,in_stack_fffffffffffffed0),allocator_01);
  VVar2.data_.s.str = (Ch *)extraout_RDX;
  VVar2.data_.n = (Number)in_RDI;
  return (Value)VVar2.data_;
}

Assistant:

rapidjson::Value xmrig::Cpu::toJSON(rapidjson::Document &doc)
{
    using namespace rapidjson;
    auto &allocator = doc.GetAllocator();

    ICpuInfo *i = info();
    Value cpu(kObjectType);
    Assembly assembly(i->assembly());

    cpu.AddMember("brand",      StringRef(i->brand()), allocator);
    cpu.AddMember("aes",        i->hasAES(), allocator);
    cpu.AddMember("avx2",       i->hasAVX2(), allocator);
    cpu.AddMember("x64",        ICpuInfo::isX64(), allocator);
    cpu.AddMember("l2",         static_cast<uint64_t>(i->L2()), allocator);
    cpu.AddMember("l3",         static_cast<uint64_t>(i->L3()), allocator);
    cpu.AddMember("cores",      static_cast<uint64_t>(i->cores()), allocator);
    cpu.AddMember("threads",    static_cast<uint64_t>(i->threads()), allocator);
    cpu.AddMember("packages",   static_cast<uint64_t>(i->packages()), allocator);
    cpu.AddMember("nodes",      static_cast<uint64_t>(i->nodes()), allocator);
    cpu.AddMember("backend",    StringRef(i->backend()), allocator);

    cpu.AddMember("assembly", "none", allocator);

    return cpu;
}